

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UBool __thiscall icu_63::ResourceArray::getValue(ResourceArray *this,int32_t i,ResourceValue *value)

{
  uint32_t r;
  ResourceDataValue *rdValue;
  ResourceValue *value_local;
  int32_t i_local;
  ResourceArray *this_local;
  
  if ((i < 0) || (this->length <= i)) {
    this_local._7_1_ = '\0';
  }
  else {
    r = internalGetResource(this,(ResourceData *)value[1].super_UObject._vptr_UObject,i);
    ResourceDataValue::setResource((ResourceDataValue *)value,r);
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool icu::ResourceArray::getValue(int32_t i, icu::ResourceValue &value) const {
    if(0 <= i && i < length) {
        icu::ResourceDataValue &rdValue = static_cast<icu::ResourceDataValue &>(value);
        rdValue.setResource(internalGetResource(rdValue.pResData, i));
        return TRUE;
    }
    return FALSE;
}